

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcBlast.c
# Opt level: O3

void Wlc_BlastFullAdder(Gia_Man_t *pNew,int a,int b,int c,int *pc,int *ps)

{
  uint iLit0;
  uint uVar1;
  uint iLit1;
  int iVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  
  bVar3 = a != 1;
  bVar4 = b != 1;
  bVar5 = c != 1;
  if (bVar5 && (bVar4 && bVar3)) {
    iLit0 = Gia_ManHashAnd(pNew,a,b);
    if ((a < 0) || (b < 0)) goto LAB_0089bdce;
    a = a ^ 1;
  }
  else {
    if (((a < 0) || (b < 0)) || (c < 0)) goto LAB_0089bdce;
    b = b ^ 1;
    c = c ^ 1;
    iLit0 = Gia_ManHashAnd(pNew,a ^ 1,b);
  }
  uVar1 = Gia_ManHashAnd(pNew,a,b ^ 1);
  if ((-1 < (int)iLit0) && (-1 < (int)uVar1)) {
    uVar1 = Gia_ManHashAnd(pNew,iLit0 ^ 1,uVar1 ^ 1);
    iLit1 = Gia_ManHashAnd(pNew,c,uVar1);
    if (((-1 < c) &&
        ((-1 < (int)uVar1 && (uVar1 = Gia_ManHashAnd(pNew,c ^ 1,uVar1 ^ 1), -1 < (int)iLit1)))) &&
       (-1 < (int)uVar1)) {
      iVar2 = Gia_ManHashAnd(pNew,iLit1 ^ 1,uVar1 ^ 1);
      *ps = iVar2;
      iVar2 = Gia_ManHashOr(pNew,iLit0,iLit1);
      *pc = iVar2;
      if (bVar5 && (bVar4 && bVar3)) {
        return;
      }
      if (-1 < *ps) {
        *ps = *ps ^ 1;
        if (-1 < *pc) {
          *pc = *pc ^ 1;
          return;
        }
      }
    }
  }
LAB_0089bdce:
  __assert_fail("Lit >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                ,0x131,"int Abc_LitNot(int)");
}

Assistant:

void Wlc_BlastFullAdder( Gia_Man_t * pNew, int a, int b, int c, int * pc, int * ps )
{
    int fUseXor = 0;
    int fCompl = (a == 1 || b == 1 || c == 1);
    // propagate complement through the FA - helps generate less redundant logic
    if ( fCompl )
        a = Abc_LitNot(a), b = Abc_LitNot(b), c = Abc_LitNot(c); 
    if ( fUseXor )
    {
        int Xor  = Gia_ManHashXor(pNew, a, b);
        int And1 = Gia_ManHashAnd(pNew, a, b);
        int And2 = Gia_ManHashAnd(pNew, c, Xor);
        *ps      = Gia_ManHashXor(pNew, c, Xor);
        *pc      = Gia_ManHashOr (pNew, And1, And2);
    }
    else
    {
        int And1 = Gia_ManHashAnd(pNew, a, b);
        int And1_= Gia_ManHashAnd(pNew, Abc_LitNot(a), Abc_LitNot(b));
        int Xor  = Gia_ManHashAnd(pNew, Abc_LitNot(And1), Abc_LitNot(And1_));
        int And2 = Gia_ManHashAnd(pNew, c, Xor);
        int And2_= Gia_ManHashAnd(pNew, Abc_LitNot(c), Abc_LitNot(Xor));
        *ps      = Gia_ManHashAnd(pNew, Abc_LitNot(And2), Abc_LitNot(And2_));
        *pc      = Gia_ManHashOr (pNew, And1, And2);
    }
    if ( fCompl )
        *ps = Abc_LitNot(*ps), *pc = Abc_LitNot(*pc); 
}